

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forkfd.c
# Opt level: O2

int tryReaping(pid_t pid,pipe_payload *payload)

{
  __pid_t _Var1;
  uint uVar2;
  int iVar3;
  long in_FS_OFFSET;
  int status;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  status = -0x55555556;
  iVar3 = 1;
  _Var1 = wait4(pid,&status,1,(rusage *)&payload->rusage);
  if (_Var1 < 1) {
    iVar3 = 0;
  }
  else {
    uVar2 = status & 0x7f;
    if (uVar2 == 0) {
      (payload->info).code = 1;
      uVar2 = (uint)status >> 8 & 0xff;
    }
    else {
      if ((int)(uVar2 * 0x1000000 + 0x1000000) < 0x2000000) goto LAB_003e66e6;
      (payload->info).code = -1 < (char)status ^ 3;
    }
    (payload->info).status = uVar2;
  }
LAB_003e66e6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

static int tryReaping(pid_t pid, struct pipe_payload *payload)
{
    /* reap the child */
#if defined(HAVE_WAIT4)
    int status;
    if (wait4(pid, &status, WNOHANG, &payload->rusage) <= 0)
        return 0;
    convertStatusToForkfdInfo(status, &payload->info);
#else
#  if defined(HAVE_WAITID)
    if (waitid_works) {
        /* we have waitid(2), which gets us some payload values on some systems */
        siginfo_t info;
        info.si_pid = 0;
        int ret = waitid(P_PID, pid, &info, WEXITED | WNOHANG) == 0 && info.si_pid == pid;
        if (!ret)
            return ret;

        payload->info.code = info.si_code;
        payload->info.status = info.si_status;
#    ifdef __linux__
        payload->rusage.ru_utime.tv_sec = info.si_utime / CLOCKS_PER_SEC;
        payload->rusage.ru_utime.tv_usec = info.si_utime % CLOCKS_PER_SEC;
        payload->rusage.ru_stime.tv_sec = info.si_stime / CLOCKS_PER_SEC;
        payload->rusage.ru_stime.tv_usec = info.si_stime % CLOCKS_PER_SEC;
#    endif
        return 1;
    }
#  endif // HAVE_WAITID
    int status;
    if (waitpid(pid, &status, WNOHANG) <= 0)
        return 0;     // child did not change state
    convertStatusToForkfdInfo(status, &payload->info);
#endif // !HAVE_WAIT4

    return 1;
}